

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void DeCoalesce(VmInstruction *variable,VmFunction *function,VmInstruction *currIdom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  VmInstruction *pVVar4;
  VmInstruction *pVVar5;
  bool local_34;
  byte local_33;
  bool local_32;
  bool local_31;
  uint currAncestoreCopyCount;
  uint variableCopyCount;
  VmInstruction *currAncestor;
  VmInstruction *currIdom_local;
  VmFunction *function_local;
  VmInstruction *variable_local;
  
  currAncestor = currIdom;
  while( true ) {
    local_31 = false;
    if (currAncestor != (VmInstruction *)0x0) {
      bVar1 = Dominates(currAncestor,variable);
      local_32 = true;
      if (bVar1) {
        local_32 = Uncolored(currAncestor);
      }
      local_31 = local_32;
    }
    if (local_31 == false) break;
    currAncestor = currAncestor->idom;
  }
  variable->idom = currAncestor;
  variable->intersectingIdom = (VmInstruction *)0x0;
  _currAncestoreCopyCount = variable->idom;
  while( true ) {
    do {
      if (_currAncestoreCopyCount == (VmInstruction *)0x0) {
        return;
      }
      while( true ) {
        local_33 = 0;
        if (_currAncestoreCopyCount != (VmInstruction *)0x0) {
          bVar1 = Colored(_currAncestoreCopyCount);
          local_34 = false;
          if (bVar1) {
            local_34 = Intersect(_currAncestoreCopyCount,variable);
          }
          local_33 = local_34 ^ 0xff;
        }
        if ((local_33 & 1) == 0) break;
        _currAncestoreCopyCount = _currAncestoreCopyCount->intersectingIdom;
      }
    } while (_currAncestoreCopyCount == (VmInstruction *)0x0);
    pVVar4 = UnderlyingValue(_currAncestoreCopyCount);
    pVVar5 = UnderlyingValue(variable);
    if (pVVar4 == pVVar5) break;
    uVar3 = function->nextSearchMarker;
    function->nextSearchMarker = uVar3 + 1;
    uVar2 = GetSplitCopyCount(variable,uVar3);
    uVar3 = function->nextSearchMarker;
    function->nextSearchMarker = uVar3 + 1;
    uVar3 = GetSplitCopyCount(_currAncestoreCopyCount,uVar3);
    if ((variable->color == 0) || (uVar2 < uVar3)) {
      UncolorAtomicMergeSet(variable);
      return;
    }
    UncolorAtomicMergeSet(_currAncestoreCopyCount);
    _currAncestoreCopyCount = _currAncestoreCopyCount->intersectingIdom;
  }
  variable->intersectingIdom = _currAncestoreCopyCount;
  return;
}

Assistant:

void DeCoalesce(VmInstruction *variable, VmFunction* function, VmInstruction *currIdom)
{
	while(currIdom != NULL && (!Dominates(currIdom, variable) || Uncolored(currIdom)))
		currIdom = currIdom->idom;

	variable->idom = currIdom;
	variable->intersectingIdom = NULL;

	VmInstruction *currAncestor = variable->idom;

	while(currAncestor)
	{
		while(currAncestor && !(Colored(currAncestor) && Intersect(currAncestor, variable)))
			currAncestor = currAncestor->intersectingIdom;

		if(currAncestor)
		{
			if(UnderlyingValue(currAncestor) == UnderlyingValue(variable))
			{
				variable->intersectingIdom = currAncestor;
				break;
			}
			else
			{
				unsigned variableCopyCount = GetSplitCopyCount(variable, function->nextSearchMarker++);
				unsigned currAncestoreCopyCount = GetSplitCopyCount(currAncestor, function->nextSearchMarker++);

				// v and currAnc interfere
				// It's preferable to uncolor a variable that is already uncolored or a variable that will split the lesser number of copies
				if(variable->color == 0 || variableCopyCount < currAncestoreCopyCount)
				{
					UncolorAtomicMergeSet(variable);

					break;
				}
				else
				{
					UncolorAtomicMergeSet(currAncestor);

					currAncestor = currAncestor->intersectingIdom;
				}
			}
		}
	}
}